

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_TestShell::createTest
          (TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_TestShell *this)

{
  Utest *this_00;
  TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0x259);
  TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test::
  TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test
            ((TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test *)this_00);
  return this_00;
}

Assistant:

TEST(SimpleStringBuffer, setWriteLimitTooHighIsIgnored)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN+10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN+10; i++)
        buffer.add("h");
    SimpleString str("h", SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN-1);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}